

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

void luaT_callTM(lua_State *L,TValue *f,TValue *p1,TValue *p2,TValue *p3)

{
  StkId func;
  
  func = (L->top).p;
  (func->val).value_ = f->value_;
  (func->val).tt_ = f->tt_;
  func[1].val.value_ = p1->value_;
  *(lu_byte *)((long)func + 0x18) = p1->tt_;
  func[2].val.value_ = p2->value_;
  *(lu_byte *)((long)func + 0x28) = p2->tt_;
  func[3].val.value_ = p3->value_;
  *(lu_byte *)((long)func + 0x38) = p3->tt_;
  (L->top).p = func + 4;
  if ((L->ci->callstatus & 10) != 0) {
    luaD_callnoyield(L,func,0);
    return;
  }
  luaD_call(L,func,0);
  return;
}

Assistant:

void luaT_callTM (lua_State *L, const TValue *f, const TValue *p1,
                  const TValue *p2, const TValue *p3) {
  StkId func = L->top.p;
  setobj2s(L, func, f);  /* push function (assume EXTRA_STACK) */
  setobj2s(L, func + 1, p1);  /* 1st argument */
  setobj2s(L, func + 2, p2);  /* 2nd argument */
  setobj2s(L, func + 3, p3);  /* 3rd argument */
  L->top.p = func + 4;
  /* metamethod may yield only when called from Lua code */
  if (isLuacode(L->ci))
    luaD_call(L, func, 0);
  else
    luaD_callnoyield(L, func, 0);
}